

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

FromBase64Result *
QByteArray::fromBase64Encoding
          (FromBase64Result *__return_storage_ptr__,QByteArray *base64,Base64Options options)

{
  qsizetype qVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char *output;
  char *input;
  long in_FS_OFFSET;
  fromBase64_helper_result fVar6;
  QByteArray local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = (base64->d).size;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray(&local_48,(ulong)(qVar1 * 3) >> 2,Uninitialized);
  input = (base64->d).ptr;
  if (input == (char *)0x0) {
    input = "";
  }
  output = local_48.d.ptr;
  if (local_48.d.ptr == (char *)0x0) {
    output = "";
  }
  fVar6 = anon_unknown.dwarf_bea423::fromBase64_helper(input,qVar1,output,options);
  if (fVar6.decodedLength < local_48.d.size) {
    resize(&local_48,fVar6.decodedLength);
  }
  qVar1 = local_48.d.size;
  uVar2 = local_48.d.d._0_4_;
  uVar3 = local_48.d.d._4_4_;
  uVar4 = local_48.d.ptr._0_4_;
  uVar5 = local_48.d.ptr._4_4_;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char *)0x0;
  *(undefined4 *)&(__return_storage_ptr__->decoded).d.d = uVar2;
  *(undefined4 *)((long)&(__return_storage_ptr__->decoded).d.d + 4) = uVar3;
  *(undefined4 *)&(__return_storage_ptr__->decoded).d.ptr = uVar4;
  *(undefined4 *)((long)&(__return_storage_ptr__->decoded).d.ptr + 4) = uVar5;
  local_48.d.size = 0;
  (__return_storage_ptr__->decoded).d.size = qVar1;
  __return_storage_ptr__->decodingStatus = fVar6.status;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray::FromBase64Result QByteArray::fromBase64Encoding(const QByteArray &base64, Base64Options options)
{
    const auto base64Size = base64.size();
    QByteArray result((base64Size * 3) / 4, Qt::Uninitialized);
    const auto base64result = fromBase64_helper(base64.data(),
                                                base64Size,
                                                const_cast<char *>(result.constData()),
                                                options);
    result.truncate(base64result.decodedLength);
    return { std::move(result), base64result.status };
}